

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

void __thiscall
draco::Metadata::AddEntry<std::__cxx11::string>
          (Metadata *this,string *entry_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry_value)

{
  iterator __position;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>
  *__args;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>
  local_58;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                       *)this,entry_name);
  if ((_Rb_tree_header *)__position._M_node != &(this->entries_)._M_t._M_impl.super__Rb_tree_header)
  {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,draco::EntryValue>,std::_Select1st<std::pair<std::__cxx11::string_const,draco::EntryValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,draco::EntryValue>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,draco::EntryValue>,std::_Select1st<std::pair<std::__cxx11::string_const,draco::EntryValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,draco::EntryValue>>>
                        *)this,__position);
  }
  EntryValue::EntryValue((EntryValue *)&local_70,entry_value);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>
  ::pair<draco::EntryValue,_true>(&local_58,entry_name,(EntryValue *)&local_70);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,draco::EntryValue>,std::_Select1st<std::pair<std::__cxx11::string_const,draco::EntryValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,draco::EntryValue>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,draco::EntryValue>>
            ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_bool>
              *)this,(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,draco::EntryValue>,std::_Select1st<std::pair<std::__cxx11::string_const,draco::EntryValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,draco::EntryValue>>>
                      *)&local_58,__args);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>
  ::~pair(&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  return;
}

Assistant:

void AddEntry(const std::string &entry_name, const DataTypeT &entry_value) {
    const auto itr = entries_.find(entry_name);
    if (itr != entries_.end()) {
      entries_.erase(itr);
    }
    entries_.insert(std::make_pair(entry_name, EntryValue(entry_value)));
  }